

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# zutil.c
# Opt level: O0

void zcheck_tempv(int n,doublecomplex *tempv)

{
  char local_128 [8];
  char msg [256];
  uint local_1c;
  int i;
  doublecomplex *tempv_local;
  int n_local;
  
  for (local_1c = 0; (int)local_1c < n; local_1c = local_1c + 1) {
    if ((((tempv[(int)local_1c].r != 0.0) || (NAN(tempv[(int)local_1c].r))) ||
        (tempv[(int)local_1c].i != 0.0)) || (NAN(tempv[(int)local_1c].i))) {
      fprintf(_stderr,"tempv[%d] = {%f, %f}\n",tempv[(int)local_1c].r,(ulong)local_1c);
      sprintf(local_128,"%s at line %d in file %s\n","zcheck_tempv",0x15c,
              "/workspace/llm4binary/github/license_c_cmakelists/xiaoyeli[P]superlu/SRC/zutil.c");
      superlu_abort_and_exit(local_128);
    }
  }
  return;
}

Assistant:

void zcheck_tempv(int n, doublecomplex *tempv)
{
    int i;
	
    for (i = 0; i < n; i++) {
	if ((tempv[i].r != 0.0) || (tempv[i].i != 0.0))
	{
	    fprintf(stderr,"tempv[%d] = {%f, %f}\n", i, tempv[i].r, tempv[i].i);
	    ABORT("zcheck_tempv");
	}
    }
}